

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeMemoryFill(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name mem)

{
  Name memory;
  MemoryFill *pMVar1;
  bool bVar2;
  Ok local_d9;
  IRBuilder *local_d8;
  size_t local_d0;
  uint local_c4;
  Err local_c0;
  Err *local_90;
  Err *err;
  Result<wasm::Ok> _val;
  MemoryFill curr;
  IRBuilder *this_local;
  Name mem_local;
  
  mem_local.super_IString.str._M_len = mem.super_IString.str._M_str;
  this_local = mem.super_IString.str._M_len;
  pMVar1 = (MemoryFill *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.memory.super_IString.str._M_str = (char *)this;
  mem_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  MemoryFill::MemoryFill(pMVar1);
  wasm::Name::operator=((Name *)&curr.size,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitMemoryFill
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pMVar1);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_90 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_c0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  local_c4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_c4 == 0) {
    local_d8 = this_local;
    local_d0 = mem_local.super_IString.str._M_len;
    memory.super_IString.str._M_str = (char *)mem_local.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)this_local;
    pMVar1 = Builder::makeMemoryFill
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)39>.super_Expression.
                        type.id,curr.dest,curr.value,memory);
    push(this,(Expression *)pMVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeMemoryFill(Name mem) {
  MemoryFill curr;
  curr.memory = mem;
  CHECK_ERR(visitMemoryFill(&curr));
  push(builder.makeMemoryFill(curr.dest, curr.value, curr.size, mem));
  return Ok{};
}